

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::StringToInt64Map::StringToInt64Map(StringToInt64Map *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__StringToInt64Map_003b7100;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->map_).arena_ = (Arena *)0x0;
  *(undefined8 *)((long)&(this->map_).arena_ + 4) = 0;
  *(undefined8 *)((long)&(this->map_).map_.arena_ + 4) = 0;
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::Init
            (&(this->map_).map_);
  (this->map_).map_.default_enum_value_ = 0;
  if (this != (StringToInt64Map *)&_StringToInt64Map_default_instance_) {
    protobuf_DataStructures_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  return;
}

Assistant:

StringToInt64Map::StringToInt64Map()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_DataStructures_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.StringToInt64Map)
}